

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
pstore::json::details::object_matcher<pstore::exchange::import_ns::callbacks>::end_object
          (object_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser)

{
  error_code eVar1;
  error_code local_20;
  
  eVar1 = exchange::import_ns::callbacks::end_object(&parser->callbacks_);
  local_20._M_cat = eVar1._M_cat;
  local_20._M_value = eVar1._M_value;
  matcher<pstore::exchange::import_ns::callbacks>::set_error
            (&this->super_matcher<pstore::exchange::import_ns::callbacks>,parser,&local_20);
  (this->super_matcher<pstore::exchange::import_ns::callbacks>).state_ = 1;
  return;
}

Assistant:

void object_matcher<Callbacks>::end_object (parser<Callbacks> & parser) {
                this->set_error (parser, parser.callbacks ().end_object ());
                this->set_state (done_state);
            }